

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoveGeneration.h
# Opt level: O1

MoveList * __thiscall
libchess::Position::legal_move_list(MoveList *__return_storage_ptr__,Position *this,Color stm)

{
  Move move;
  pointer pMVar1;
  long lVar2;
  bool bVar3;
  ulong uVar4;
  Bitboard BVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  pointer pMVar9;
  PieceType pt;
  long lVar10;
  ulong uVar11;
  
  uVar6 = this->color_bb_[0].value_;
  uVar4 = this->piece_type_bb_[5].value_ &
          this->color_bb_[(int)stm.super_MetaValueType<int>.value_].value_;
  lVar2 = 0;
  if (uVar4 != 0) {
    for (; (uVar4 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
    }
  }
  uVar4 = this->color_bb_[1].value_;
  uVar7 = (uVar6 & *(ulong *)(&DAT_001415a0 + lVar2 * 8) | uVar4 & (&lookups::PAWN_ATTACKS)[lVar2])
          & this->piece_type_bb_[0].value_;
  lVar10 = 1;
  do {
    BVar5 = lookups::non_pawn_piece_type_attacks
                      ((MetaValueType<int>)(value_type)lVar10,(MetaValueType<int>)(value_type)lVar2,
                       (Bitboard)(uVar4 | uVar6));
    uVar7 = uVar7 | BVar5.value_ & this->piece_type_bb_[lVar10].value_;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 6);
  if ((this->color_bb_[stm.super_MetaValueType<int>.value_ == 0].value_ & uVar7) == 0) {
    pseudo_legal_move_list(__return_storage_ptr__,this);
  }
  else {
    check_evasion_move_list
              (__return_storage_ptr__,this,
               (Color)(this->side_to_move_).super_MetaValueType<int>.value_);
  }
  uVar6 = this->color_bb_[(int)stm.super_MetaValueType<int>.value_].value_;
  uVar4 = this->piece_type_bb_[5].value_ & uVar6;
  lVar2 = 0;
  if (uVar4 != 0) {
    for (; (uVar4 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
    }
  }
  uVar4 = this->piece_type_bb_[4].value_;
  uVar7 = (ulong)(uint)((int)lVar2 << 3);
  uVar4 = ((uVar4 | this->piece_type_bb_[2].value_) &
           *(ulong *)((long)&lookups::BISHOP_ATTACKS + uVar7) |
          (this->piece_type_bb_[3].value_ | uVar4) &
          *(ulong *)((long)&lookups::ROOK_ATTACKS + uVar7)) &
          this->color_bb_[stm.super_MetaValueType<int>.value_ == 0].value_;
  if (uVar4 == 0) {
    uVar11 = 0;
  }
  else {
    uVar11 = 0;
    do {
      lVar2 = 0;
      if (uVar4 != 0) {
        for (; (uVar4 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
        }
      }
      uVar8 = *(ulong *)(lookups::INTERVENING + (uint)((int)lVar2 << 9) + uVar7) &
              (this->color_bb_[1].value_ | this->color_bb_[0].value_);
      if (uVar8 - 1 < (uVar8 ^ uVar8 - 1)) {
        uVar8 = uVar8 & uVar6;
      }
      else {
        uVar8 = 0;
      }
      uVar11 = uVar11 ^ uVar8;
      uVar4 = uVar4 & uVar4 - 1;
    } while (uVar4 != 0);
  }
  pMVar9 = (__return_storage_ptr__->values_).
           super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>._M_impl.
           super__Vector_impl_data._M_start;
  do {
    while( true ) {
      if (pMVar9 == (__return_storage_ptr__->values_).
                    super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
        return __return_storage_ptr__;
      }
      move.value_ = pMVar9->value_;
      if (((uVar11 >> (move.value_ & 0x3fU) & 1) != 0) || ((move.value_ & 0x38000U) == 0x18000))
      break;
      uVar6 = this->piece_type_bb_[5].value_ &
              this->color_bb_[(int)stm.super_MetaValueType<int>.value_].value_;
      lVar2 = 0;
      if (uVar6 != 0) {
        for (; (uVar6 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
        }
      }
      if ((move.value_ & 0x3fU) == (uint)lVar2) break;
LAB_001171b8:
      pMVar9 = pMVar9 + 1;
    }
    bVar3 = is_legal_generated_move(this,move);
    if (bVar3) goto LAB_001171b8;
    pMVar1 = (__return_storage_ptr__->values_).
             super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pMVar9->value_ = pMVar1[-1].value_;
    (__return_storage_ptr__->values_).
    super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>._M_impl.
    super__Vector_impl_data._M_finish = pMVar1 + -1;
  } while( true );
}

Assistant:

inline MoveList Position::legal_move_list(Color stm) const {
    MoveList move_list = checkers_to(stm) ? check_evasion_move_list() : pseudo_legal_move_list();
    Bitboard pinned = pinned_pieces_of(stm);
    for (auto move = move_list.begin(); move != move_list.end();) {
        if (((pinned & Bitboard{move->from_square()}) || move->from_square() == king_square(stm) ||
             move->type() == Move::Type::ENPASSANT) &&
            !is_legal_generated_move(*move)) {
            *move = *(move_list.end() - 1);
            move_list.pop_back();
        } else {
            ++move;
        }
    }
    return move_list;
}